

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLengthen.cpp
# Opt level: O1

int CmdLengthen(CLI *cli,Rules *rules,Database *database,Journal *journal)

{
  Interval *pIVar1;
  bool verbose;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  time_t delta;
  ostream *poVar4;
  string *psVar5;
  string *psVar6;
  Interval *pIVar7;
  pointer interval;
  iterator __end3;
  vector<Interval,_std::allocator<Interval>_> intervals;
  set<int,_std::less<int>,_std::allocator<int>_> ids;
  IntervalFilterAllWithIds filtering;
  Duration dur;
  char local_159;
  string local_158;
  Journal *local_138;
  CLI *local_130;
  Rules *local_128;
  vector<Interval,_std::allocator<Interval>_> local_120;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_108;
  undefined1 local_d8 [16];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_88;
  Duration local_58;
  
  local_138 = journal;
  local_d8._0_8_ = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"verbose","");
  verbose = Rules::getBoolean(rules,(string *)local_d8,false);
  if ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
      local_d8._0_8_ != &local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8._M_impl._0_8_ + 1);
  }
  CLI::getIds((set<int,_std::less<int>,_std::allocator<int>_> *)&local_108,cli);
  if (local_108._M_impl.super__Rb_tree_header._M_node_count == 0) {
    psVar6 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar6 = psVar6 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar6,"IDs must be specified. See \'timew help lengthen\'.","");
    __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  CLI::getDuration(&local_58,cli);
  Journal::startTransaction(local_138);
  flattenDatabase(database,rules);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_88,&local_108);
  IntervalFilterAllWithIds::IntervalFilterAllWithIds
            ((IntervalFilterAllWithIds *)local_d8,
             (set<int,_std::less<int>,_std::allocator<int>_> *)&local_88);
  local_130 = cli;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_88);
  local_128 = rules;
  getTracked(&local_120,database,rules,(IntervalFilter *)local_d8);
  if ((((long)local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_start >> 6) * -0x5555555555555555 -
       local_108._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (p_Var3 = local_108._M_impl.super__Rb_tree_header._M_header._M_left,
     (_Rb_tree_header *)local_108._M_impl.super__Rb_tree_header._M_header._M_left !=
     &local_108._M_impl.super__Rb_tree_header)) {
    do {
      if (local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0014341b:
        psVar5 = (string *)__cxa_allocate_exception(0x20);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,"ID \'@{1}\' does not correspond to any tracking.","");
        format<int>(psVar5,1,&local_158,p_Var3[1]._M_color);
        __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      bVar2 = false;
      pIVar1 = local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pIVar7 = pIVar1 + 1;
        if (pIVar1->id == p_Var3[1]._M_color) {
          bVar2 = true;
          break;
        }
        pIVar1 = pIVar7;
      } while (pIVar7 != local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      if (!bVar2) goto LAB_0014341b;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != &local_108._M_impl.super__Rb_tree_header);
  }
  if (local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    interval = local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      bVar2 = Range::is_open(&interval->super_Range);
      if (bVar2) {
        psVar5 = (string *)__cxa_allocate_exception(0x20);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,"Cannot lengthen open interval @{1}","");
        format<int>(psVar5,1,&local_158,interval->id);
        __cxa_throw(psVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      Database::deleteInterval(database,interval);
      delta = Duration::toTime_t(&local_58);
      Datetime::operator+=(&(interval->super_Range).end,delta);
      validate(local_130,local_128,database,interval);
      Database::addInterval(database,interval,verbose);
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Lengthened @",0xc)
        ;
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,interval->id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," by ",4);
        Duration::formatHours_abi_cxx11_(&local_158,&local_58);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_158._M_dataplus._M_p,local_158._M_string_length);
        local_159 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_159,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
      }
      interval = interval + 1;
    } while (interval !=
             local_120.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  Journal::endTransaction(local_138);
  std::vector<Interval,_std::allocator<Interval>_>::~vector(&local_120);
  local_d8._0_8_ = &PTR_accepts_001a1980;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_c8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_108);
  return 0;
}

Assistant:

int CmdLengthen (
  CLI& cli,
  Rules& rules,
  Database& database,
  Journal& journal)
{
  const bool verbose = rules.getBoolean ("verbose");

  auto ids = cli.getIds ();

  if (ids.empty ())
  {
    throw std::string ("IDs must be specified. See 'timew help lengthen'.");
  }

  auto dur = cli.getDuration ();

  journal.startTransaction ();

  flattenDatabase (database, rules);
  auto filtering = IntervalFilterAllWithIds (ids);
  auto intervals = getTracked (database, rules, filtering);

  if (intervals.size () != ids.size ())
  {
    for (auto& id: ids)
    {
      bool found = false;

      for (auto& interval: intervals)
      {
        if (interval.id == id)
        {
          found = true;
          break;
        }
      }
      if (! found)
      {
        throw format ("ID '@{1}' does not correspond to any tracking.", id);
      }
    }
  }

  // Lengthen intervals specified by ids
  for (auto& interval : intervals)
  {
    if (interval.is_open ())
    {
      throw format ("Cannot lengthen open interval @{1}", interval.id);
    }

    database.deleteInterval (interval);

    interval.end += dur.toTime_t ();
    validate (cli, rules, database, interval);
    database.addInterval (interval, verbose);

    if (verbose)
    {
      std::cout << "Lengthened @" << interval.id << " by " << dur.formatHours () << '\n';
    }
  }

  journal.endTransaction ();

  return 0;
}